

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

IString __thiscall wasm::Wasm2JSBuilder::getTemp(Wasm2JSBuilder *this,Type type,Function *func)

{
  pointer pvVar1;
  pointer pIVar2;
  pointer puVar3;
  ulong uVar4;
  bool bVar5;
  size_t sVar6;
  char cVar7;
  char cVar8;
  undefined8 *puVar9;
  long *plVar10;
  size_t sVar11;
  __node_base_ptr p_Var12;
  ulong *puVar13;
  ulong uVar14;
  char *pcVar15;
  Type in_R8;
  __hash_code __code;
  string_view sVar16;
  Name name;
  ulong *local_f8;
  long local_f0;
  ulong local_e8 [2];
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  ulong *local_b8;
  uintptr_t local_b0;
  ulong local_a8;
  long lStack_a0;
  long *local_98;
  undefined8 local_90;
  long local_88;
  undefined8 uStack_80;
  string_view local_78;
  long local_68;
  undefined8 uStack_60;
  size_type *local_58;
  string __str;
  Type type_local;
  
  __str.field_2._8_8_ = type.id;
  cVar8 = ::wasm::Type::isTuple();
  if (cVar8 != '\0') {
    pcVar15 = "!type.isTuple() && \"Unexpected tuple type\"";
LAB_00166be8:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm2js.h"
                  ,0xce,"IString wasm::Wasm2JSBuilder::getTemp(Type, Function *)");
  }
  if (6 < (ulong)__str.field_2._8_8_) {
    pcVar15 = "type.isBasic() && \"TODO: handle compound types\"";
    goto LAB_00166be8;
  }
  pvVar1 = (this->frees).
           super__Vector_base<std::vector<wasm::IString,_std::allocator<wasm::IString>_>,_std::allocator<std::vector<wasm::IString,_std::allocator<wasm::IString>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = *(pointer *)
            ((long)&pvVar1[__str.field_2._8_8_].
                    super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (pIVar2 != pvVar1[__str.field_2._8_8_].
                super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
                super__Vector_impl_data._M_start) {
    sVar16 = pIVar2[-1].str;
    *(pointer *)
     ((long)&pvVar1[__str.field_2._8_8_].
             super__Vector_base<wasm::IString,_std::allocator<wasm::IString>_>._M_impl.
             super__Vector_impl_data + 8) = pIVar2 + -1;
    goto LAB_00166b77;
  }
  puVar3 = (this->temps).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = puVar3[__str.field_2._8_8_];
  puVar3[__str.field_2._8_8_] = uVar4 + 1;
  local_f8 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"wasm2js_","");
  ::wasm::Type::toString_abi_cxx11_();
  uVar14 = 0xf;
  if (local_f8 != local_e8) {
    uVar14 = local_e8[0];
  }
  if (uVar14 < (ulong)(local_d0 + local_f0)) {
    uVar14 = 0xf;
    if (local_d8 != local_c8) {
      uVar14 = local_c8[0];
    }
    if (uVar14 < (ulong)(local_d0 + local_f0)) goto LAB_001668c8;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_f8);
  }
  else {
LAB_001668c8:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d8);
  }
  local_98 = &local_88;
  plVar10 = puVar9 + 2;
  if ((long *)*puVar9 == plVar10) {
    local_88 = *plVar10;
    uStack_80 = puVar9[3];
  }
  else {
    local_88 = *plVar10;
    local_98 = (long *)*puVar9;
  }
  local_90 = puVar9[1];
  *puVar9 = plVar10;
  puVar9[1] = 0;
  *(undefined1 *)plVar10 = 0;
  plVar10 = (long *)std::__cxx11::string::append((char *)&local_98);
  puVar13 = (ulong *)(plVar10 + 2);
  if ((ulong *)*plVar10 == puVar13) {
    local_a8 = *puVar13;
    lStack_a0 = plVar10[3];
    local_b8 = &local_a8;
  }
  else {
    local_a8 = *puVar13;
    local_b8 = (ulong *)*plVar10;
  }
  local_b0 = plVar10[1];
  *plVar10 = (long)puVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  cVar8 = '\x01';
  if (9 < uVar4) {
    uVar14 = uVar4;
    cVar7 = '\x04';
    do {
      cVar8 = cVar7;
      if (uVar14 < 100) {
        cVar8 = cVar8 + -2;
        goto LAB_001669ef;
      }
      if (uVar14 < 1000) {
        cVar8 = cVar8 + -1;
        goto LAB_001669ef;
      }
      if (uVar14 < 10000) goto LAB_001669ef;
      bVar5 = 99999 < uVar14;
      uVar14 = uVar14 / 10000;
      cVar7 = cVar8 + '\x04';
    } while (bVar5);
    cVar8 = cVar8 + '\x01';
  }
LAB_001669ef:
  local_58 = &__str._M_string_length;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar8);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_58,(uint)__str._M_dataplus._M_p,uVar4);
  uVar4 = CONCAT44(__str._M_dataplus._M_p._4_4_,(uint)__str._M_dataplus._M_p) + local_b0;
  uVar14 = 0xf;
  if (local_b8 != &local_a8) {
    uVar14 = local_a8;
  }
  in_R8.id = local_b0;
  if (uVar14 < uVar4) {
    uVar14 = 0xf;
    if (local_58 != &__str._M_string_length) {
      uVar14 = __str._M_string_length;
    }
    if (uVar14 < uVar4) goto LAB_00166a5a;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_b8);
  }
  else {
LAB_00166a5a:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_58);
  }
  local_78._M_len = (size_t)&local_68;
  plVar10 = puVar9 + 2;
  if ((long *)*puVar9 == plVar10) {
    local_68 = *plVar10;
    uStack_60 = puVar9[3];
  }
  else {
    local_68 = *plVar10;
    local_78._M_len = (size_t)*puVar9;
  }
  sVar6 = local_78._M_len;
  local_78._M_str = (char *)puVar9[1];
  *puVar9 = plVar10;
  puVar9[1] = 0;
  *(undefined1 *)plVar10 = 0;
  sVar11 = strlen((char *)local_78._M_len);
  sVar16 = (string_view)::wasm::IString::interned(sVar11,sVar6,0);
  if ((long *)local_78._M_len != &local_68) {
    operator_delete((void *)local_78._M_len,local_68 + 1);
  }
  if (local_58 != &__str._M_string_length) {
    operator_delete(local_58,__str._M_string_length + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8,local_e8[0] + 1);
  }
LAB_00166b77:
  pcVar15 = sVar16._M_str;
  local_78 = sVar16;
  p_Var12 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_before_node
                      (&(func->localIndices)._M_h,
                       (ulong)pcVar15 % (func->localIndices)._M_h._M_bucket_count,
                       (key_type *)&local_78,(__hash_code)pcVar15);
  if ((p_Var12 == (__node_base_ptr)0x0) || (p_Var12->_M_nxt == (_Hash_node_base *)0x0)) {
    name.super_IString.str._M_str = (char *)__str.field_2._8_8_;
    name.super_IString.str._M_len = (size_t)pcVar15;
    Builder::addVar((Builder *)func,(Function *)sVar16._M_len,name,in_R8);
  }
  return (IString)sVar16;
}

Assistant:

IString getTemp(Type type, Function* func) {
    IString ret;
    TODO_SINGLE_COMPOUND(type);
    if (frees[type.getBasic()].size() > 0) {
      ret = frees[type.getBasic()].back();
      frees[type.getBasic()].pop_back();
    } else {
      size_t index = temps[type.getBasic()]++;
      ret = IString((std::string("wasm2js_") + type.toString() + "$" +
                     std::to_string(index))
                      .c_str(),
                    false);
    }
    if (func->localIndices.find(ret) == func->localIndices.end()) {
      Builder::addVar(func, ret, type);
    }
    return ret;
  }